

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_symbol_primitive_asString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t stringSize;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    stringSize = (size_t)*(uint *)(uVar1 + 0xc);
  }
  else {
    stringSize = 0;
  }
  sVar2 = sysbvm_string_createWithString(context,stringSize,(char *)(uVar1 + 0x10));
  return sVar2;
}

Assistant:

sysbvm_tuple_t sysbvm_symbol_primitive_asString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t symbol = arguments[0];
    return sysbvm_string_createWithString(context, sysbvm_tuple_getSizeInBytes(symbol), (const char*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(symbol)->bytes);
}